

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

istream * tinyobj::safeGetline(istream *is,string *t)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int c;
  streambuf *sb;
  string *psStack_20;
  sentry se;
  string *t_local;
  istream *is_local;
  
  psStack_20 = t;
  std::__cxx11::string::clear();
  std::istream::sentry::sentry((sentry *)((long)&sb + 7),is,true);
  std::ios::rdbuf();
  bVar1 = std::istream::sentry::operator_cast_to_bool((sentry *)((long)&sb + 7));
  if (bVar1) {
    while (iVar2 = std::streambuf::sbumpc(), iVar2 != -1) {
      if (iVar2 == 10) {
        return is;
      }
      if (iVar2 == 0xd) {
        iVar2 = std::streambuf::sgetc();
        if (iVar2 != 10) {
          return is;
        }
        std::streambuf::sbumpc();
        return is;
      }
      std::__cxx11::string::operator+=((string *)psStack_20,(char)iVar2);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::ios::setstate((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    }
  }
  return is;
}

Assistant:

static std::istream &safeGetline(std::istream &is, std::string &t) {
  t.clear();

  // The characters in the stream are read one-by-one using a std::streambuf.
  // That is faster than reading them one-by-one using the std::istream.
  // Code that uses streambuf this way must be guarded by a sentry object.
  // The sentry object performs various tasks,
  // such as thread synchronization and updating the stream state.

  std::istream::sentry se(is, true);
  std::streambuf *sb = is.rdbuf();

  if (se) {
    for (;;) {
      int c = sb->sbumpc();
      switch (c) {
        case '\n':
          return is;
        case '\r':
          if (sb->sgetc() == '\n') sb->sbumpc();
          return is;
        case EOF:
          // Also handle the case when the last line has no line ending
          if (t.empty()) is.setstate(std::ios::eofbit);
          return is;
        default:
          t += static_cast<char>(c);
      }
    }
  }

  return is;
}